

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Queue.cpp
# Opt level: O0

bool __thiscall rtb::Concurrency::Queue<int>::someoneSlowerThanMe(Queue<int> *this)

{
  int iVar1;
  pointer ppVar2;
  mapped_type *pmVar3;
  key_type local_40;
  _Base_ptr local_38;
  _Rb_tree_iterator<std::pair<const_std::thread::id,_int>_> local_30;
  _Rb_tree_iterator<std::pair<const_std::thread::id,_int>_> local_28;
  int local_1c;
  Queue<int> *pQStack_18;
  int maxNoMsgToRead;
  Queue<int> *this_local;
  
  pQStack_18 = this;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
       ::begin(&this->subscribersMissingRead_);
  local_38 = (_Base_ptr)
             std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::end(&this->subscribersMissingRead_);
  local_28 = std::
             max_element<std::_Rb_tree_iterator<std::pair<std::thread::id_const,int>>,bool(*)(std::pair<std::thread::id,int>const&,std::pair<std::thread::id,int>const&)>
                       (local_30,(_Rb_tree_iterator<std::pair<const_std::thread::id,_int>_>)local_38
                        ,pred);
  ppVar2 = std::_Rb_tree_iterator<std::pair<const_std::thread::id,_int>_>::operator->(&local_28);
  iVar1 = ppVar2->second;
  local_1c = iVar1;
  local_40._M_thread = (native_handle_type)std::this_thread::get_id();
  pmVar3 = std::
           map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
           ::operator[](&this->subscribersMissingRead_,&local_40);
  return *pmVar3 < iVar1;
}

Assistant:

bool Queue<T>::someoneSlowerThanMe() {
        int maxNoMsgToRead =
            std::max_element(subscribersMissingRead_.begin(), subscribersMissingRead_.end(), pred)
                ->second;

        if (maxNoMsgToRead > subscribersMissingRead_[std::this_thread::get_id()]) return true;

        return false;
    }